

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.h
# Opt level: O3

query<int,_std::vector<char,_std::allocator<char>_>_> * __thiscall
sqlib::query<int,_std::vector<char,_std::allocator<char>_>_>::operator++
          (query<int,_std::vector<char,_std::allocator<char>_>_> *this)

{
  int iVar1;
  column_extractor ex;
  int_c<1> local_21;
  sqlite3_stmt *local_20;
  row_type *local_18;
  
  iVar1 = statement_base::step(&this->super_statement_base);
  this->m_has_data = iVar1 == 100;
  if (iVar1 == 100) {
    local_20 = (this->super_statement_base).m_prepared;
    local_18 = &this->m_row;
    iVar1 = sqlite3_column_int(local_20,0);
    (this->m_row).super__Tuple_impl<0UL,_int,_std::vector<char,_std::allocator<char>_>_>.
    super__Head_base<0UL,_int,_false>._M_head_impl = iVar1;
    query<int,std::vector<char,std::allocator<char>>>::column_extractor::operator()
              ((column_extractor *)&local_20,&local_21);
  }
  return this;
}

Assistant:

query& operator++() {
    step();
    if(m_has_data) {
      column_extractor ex(m_prepared, m_row);
      ct_for<sizeof...(Cols)>(ex);
    }
    return *this;
  }